

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O2

void __thiscall chrono::fea::ChContinuumElastic::ComputeStressStrainMatrix(ChContinuumElastic *this)

{
  ChMatrixDynamic<> *this_00;
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  this_00 = &this->StressStrainMatrix;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,6,6);
  dVar1 = this->v;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar1;
  dVar2 = this->E;
  auVar4 = vfmadd132sd_fma(auVar4,ZEXT816(0x3ff0000000000000),ZEXT816(0xc000000000000000));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,0,0);
  *pSVar3 = (((1.0 - dVar1) * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_;
  dVar1 = this->v;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1;
  dVar2 = this->E;
  auVar4 = vfmadd132sd_fma(auVar5,ZEXT816(0x3ff0000000000000),ZEXT816(0xc000000000000000));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,1,1);
  *pSVar3 = (((1.0 - dVar1) * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_;
  dVar1 = this->v;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  dVar2 = this->E;
  auVar4 = vfmadd132sd_fma(auVar6,ZEXT816(0x3ff0000000000000),ZEXT816(0xc000000000000000));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,2,2);
  *pSVar3 = (((1.0 - dVar1) * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_;
  dVar1 = this->v;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  dVar2 = this->E;
  auVar4 = vfmadd132sd_fma(auVar7,ZEXT816(0x3ff0000000000000),ZEXT816(0xc000000000000000));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,0,1);
  *pSVar3 = ((dVar1 * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_;
  dVar1 = this->v;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1;
  dVar2 = this->E;
  auVar4 = vfmadd132sd_fma(auVar8,ZEXT816(0x3ff0000000000000),ZEXT816(0xc000000000000000));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,0,2);
  *pSVar3 = ((dVar1 * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_;
  dVar1 = this->v;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  dVar2 = this->E;
  auVar4 = vfmadd132sd_fma(auVar9,ZEXT816(0x3ff0000000000000),ZEXT816(0xc000000000000000));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,1,0);
  *pSVar3 = ((dVar1 * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_;
  dVar1 = this->v;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  dVar2 = this->E;
  auVar4 = vfmadd132sd_fma(auVar10,ZEXT816(0x3ff0000000000000),ZEXT816(0xc000000000000000));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,1,2);
  *pSVar3 = ((dVar1 * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_;
  dVar1 = this->v;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  dVar2 = this->E;
  auVar4 = vfmadd132sd_fma(auVar11,ZEXT816(0x3ff0000000000000),ZEXT816(0xc000000000000000));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,2,0);
  *pSVar3 = ((dVar1 * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_;
  dVar1 = this->v;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1;
  dVar2 = this->E;
  auVar4 = vfmadd132sd_fma(auVar12,ZEXT816(0x3ff0000000000000),ZEXT816(0xc000000000000000));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,2,1);
  *pSVar3 = ((dVar1 * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_;
  dVar1 = this->v;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar13,ZEXT816(0x3ff0000000000000));
  dVar2 = this->E;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,3,3);
  *pSVar3 = (((auVar4._0_8_ * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_) * 0.5;
  dVar1 = this->v;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar14,ZEXT816(0x3ff0000000000000));
  dVar2 = this->E;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,4,4);
  *pSVar3 = (((auVar4._0_8_ * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_) * 0.5;
  dVar1 = this->v;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar15,ZEXT816(0x3ff0000000000000));
  dVar2 = this->E;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,5,5);
  *pSVar3 = (((auVar4._0_8_ * dVar2) / (dVar1 + 1.0)) / auVar4._0_8_) * 0.5;
  return;
}

Assistant:

void ChContinuumElastic::ComputeStressStrainMatrix() {
    StressStrainMatrix.setZero(6, 6);
    StressStrainMatrix(0, 0) = (E * (1 - v)) / (1 + v) / (1 - 2 * v);
    // StressStrainMatrix(1,1)=StressStrainMatrix(0,0);	//
    // StressStrainMatrix(2,2)=StressStrainMatrix(0,0);	//per non ricalcolare; qual'� meglio?
    StressStrainMatrix(1, 1) = (E * (1 - v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(2, 2) = (E * (1 - v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(0, 1) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(0, 2) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(1, 0) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(1, 2) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(2, 0) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(2, 1) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(3, 3) = (E * (1 - 2 * v)) / (1 + v) / (1 - 2 * v) / 2;
    StressStrainMatrix(4, 4) = (E * (1 - 2 * v)) / (1 + v) / (1 - 2 * v) / 2;
    StressStrainMatrix(5, 5) = (E * (1 - 2 * v)) / (1 + v) / (1 - 2 * v) / 2;
}